

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_ssg.cpp
# Opt level: O3

void __thiscall ymfm::ssg_engine::save_restore(ssg_engine *this,ymfm_saved_state *state)

{
  ymfm_saved_state::save_restore<unsigned_char[16]>(state,(this->m_regs).m_regdata);
  ymfm_saved_state::save_restore<unsigned_int[3]>(state,(uint (*) [3])this->m_tone_count);
  ymfm_saved_state::save_restore<unsigned_int[3]>(state,(uint (*) [3])this->m_tone_state);
  ymfm_saved_state::save_restore<unsigned_int>(state,&this->m_envelope_count);
  ymfm_saved_state::save_restore<unsigned_int>(state,&this->m_envelope_state);
  ymfm_saved_state::save_restore<unsigned_int>(state,&this->m_noise_count);
  ymfm_saved_state::save_restore<unsigned_int>(state,&this->m_noise_state);
  return;
}

Assistant:

void ssg_engine::save_restore(ymfm_saved_state &state)
{
	// save register state
	m_regs.save_restore(state);

	// save engine state
	state.save_restore(m_tone_count);
	state.save_restore(m_tone_state);
	state.save_restore(m_envelope_count);
	state.save_restore(m_envelope_state);
	state.save_restore(m_noise_count);
	state.save_restore(m_noise_state);
}